

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
optTyped_nullAssignmentEmptyForNotEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::
TestBody(optTyped_nullAssignmentEmptyForNotEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
         *this)

{
  bool bVar1;
  value_type_conflict *default_value;
  char *message;
  storage_type local_39;
  AssertHelper local_38;
  AssertionResult gtest_ar_;
  AssertHelper local_20;
  
  local_39.null_value = -1;
  gtest_ar_.success_ = true;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::opt<bool,_mp::opt_default_policy<bool>_>::value
              ((opt<bool,_mp::opt_default_policy<bool>_> *)&local_39);
  }
  testing::Message::Message((Message *)&gtest_ar_);
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x21e,
             "Expected: o.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar_);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
  default_value = &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_2;
  local_38.data_._0_1_ =
       mp::opt<bool,mp::opt_default_policy<bool>>::value_or<bool_const&>
                 ((opt<bool,mp::opt_default_policy<bool>> *)&local_39,default_value);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_,"this->value_2","o.value_or(this->value_2)",default_value,
             (bool *)&local_38);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x21f,message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_38);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TYPED_TEST(optTyped, nullAssignmentEmptyForNotEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o{this->value_1};
  o = nullopt;
  EXPECT_FALSE(o);
  EXPECT_FALSE(o.has_value());
  EXPECT_THROW(o.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o.value_or(this->value_2));
}